

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsModel *model,HighsSolution *solution,
                  HighsBasis *basis,HighsModelStatus model_status,HighsInfo *info)

{
  HighsDebugStatus HVar1;
  string local_108;
  HighsInfo highs_info;
  
  HighsInfo::HighsInfo(&highs_info,info);
  std::__cxx11::string::string((string *)&local_108,(string *)message);
  HVar1 = debugHighsSolution(&local_108,options,&model->lp_,&model->hessian_,solution,basis,
                             model_status,&highs_info,true);
  std::__cxx11::string::~string((string *)&local_108);
  HighsInfo::~HighsInfo(&highs_info);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsSolution(
    const string message, const HighsOptions& options, const HighsModel& model,
    const HighsSolution& solution, const HighsBasis& basis,
    const HighsModelStatus model_status, const HighsInfo& info) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to check the HiGHS model_status and info
  //
  // Copy the data from info to highs_info so general method can be used
  //
  HighsInfo highs_info = info;
  const bool check_model_status_and_highs_info = true;
  return debugHighsSolution(message, options, model.lp_, model.hessian_,
                            solution, basis, model_status, highs_info,
                            check_model_status_and_highs_info);
}